

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_tile_obu(AV1_COMP *cpi,uint8_t *dst,uint32_t *total_size,aom_write_bit_buffer *saved_wb,
                   uint8_t obu_extn_header,FrameHeaderInfo *fh_info,int *largest_tile_id,
                   uint *max_tile_size,uint32_t *obu_header_size,uint8_t **tile_data_start)

{
  int iVar1;
  FrameHeaderInfo *in_RCX;
  PackBSParams *in_RDX;
  AV1_COMP *in_RSI;
  AV1_COMP *in_RDI;
  byte in_R8B;
  int *in_stack_00000008;
  uint *in_stack_00000010;
  undefined4 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  PackBSParams pack_bs_params;
  int is_last_tile_in_tg;
  TileDataEnc *this_tile;
  int tile_idx;
  int tile_col;
  int tile_row;
  int is_first_tg;
  int new_tg;
  uint8_t *tile_data_curr;
  size_t curr_tg_data_size;
  int tile_count;
  int tg_size;
  int num_tg_hdrs;
  int tile_rows;
  int tile_cols;
  CommonTileParams *tiles;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffefc;
  aom_write_bit_buffer *in_stack_ffffffffffffff00;
  FrameHeaderInfo *fh_info_00;
  AV1_COMP *in_stack_ffffffffffffff10;
  uint local_e8;
  int in_stack_ffffffffffffff1c;
  PackBSParams *tile_data_start_00;
  AV1_COMP *largest_tile_id_00;
  AV1_COMP *is_first_tg_00;
  uint32_t in_stack_ffffffffffffff38;
  byte obu_extn_header_00;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 in_stack_ffffffffffffff60;
  int iVar5;
  int iVar6;
  int local_88;
  int local_84;
  uint32_t local_80;
  int local_7c;
  AV1_COMP *local_78;
  long local_70;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  CommonTileParams *local_50;
  MACROBLOCKD *local_48;
  AV1_COMMON *local_40;
  byte local_29;
  FrameHeaderInfo *local_28;
  PackBSParams *local_20;
  AV1_COMP *local_18;
  AV1_COMP *local_10;
  
  local_40 = &in_RDI->common;
  local_48 = &(in_RDI->td).mb.e_mbd;
  local_50 = &(in_RDI->common).tiles;
  local_54 = local_50->cols;
  local_58 = (in_RDI->common).tiles.rows;
  local_5c = in_RDI->num_tg;
  local_60 = (local_58 * local_54 + local_5c + -1) / local_5c;
  local_64 = 0;
  local_70 = 0;
  local_7c = 1;
  local_80 = 1;
  local_78 = in_RSI;
  local_29 = in_R8B;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  av1_reset_pack_bs_thread_data((ThreadData_conflict *)0x205553);
  for (local_84 = 0; local_84 < local_58; local_84 = local_84 + 1) {
    for (local_88 = 0; local_88 < local_54; local_88 = local_88 + 1) {
      iVar1 = local_84 * local_54 + local_88;
      iVar5 = 0;
      if (local_7c != 0) {
        local_78 = (AV1_COMP *)
                   ((long)((local_18->enc_quant_dequant_params).quants.y_quant + -1) +
                   (ulong)*(uint *)&local_20->saved_wb);
        local_64 = 0;
      }
      local_64 = local_64 + 1;
      if ((local_64 == local_60) || (iVar1 == local_54 * local_58 + -1)) {
        iVar5 = 1;
      }
      local_48->tile_ctx = &local_10->tile_data[iVar1].tctx;
      fh_info_00 = local_28;
      tile_data_start_00 = local_20;
      largest_tile_id_00 = local_18;
      is_first_tg_00 = local_78;
      obu_extn_header_00 = local_29;
      iVar2 = local_84;
      iVar3 = local_88;
      iVar4 = local_7c;
      iVar6 = iVar5;
      if (local_7c != 0) {
        av1_write_obu_tg_tile_headers
                  (local_78,(MACROBLOCKD *)local_18,local_20,in_stack_ffffffffffffff1c);
      }
      av1_pack_tile_info((AV1_COMP *)CONCAT44(iVar6,in_stack_ffffffffffffff60),
                         (ThreadData_conflict *)CONCAT44(iVar4,iVar5),
                         (PackBSParams *)CONCAT44(iVar3,iVar2));
      if (local_7c != 0) {
        local_70 = 0;
        *in_stack_00000020 = *in_stack_00000020;
        *in_stack_00000018 = 0;
        local_7c = 0;
      }
      if (iVar6 != 0) {
        local_7c = 1;
      }
      iVar5 = 4;
      if (iVar6 != 0) {
        iVar5 = 0;
      }
      local_70 = CONCAT44(in_stack_ffffffffffffff1c,local_e8) + (long)iVar5 + local_70;
      if ((ulong)*in_stack_00000010 < CONCAT44(in_stack_ffffffffffffff1c,local_e8)) {
        *in_stack_00000008 = iVar1;
        *in_stack_00000010 = local_e8;
      }
      if (iVar6 != 0) {
        av1_write_last_tile_info
                  (in_stack_ffffffffffffff10,fh_info_00,in_stack_ffffffffffffff00,
                   (size_t *)CONCAT44(in_stack_fffffffffffffefc,(uint)local_29),
                   (uint8_t *)CONCAT44(in_stack_fffffffffffffef4,*in_stack_00000018),&local_80,
                   (uint8_t **)tile_data_start_00,(int *)largest_tile_id_00,(int *)is_first_tg_00,
                   in_stack_ffffffffffffff38,obu_extn_header_00);
      }
      *(uint *)&local_20->saved_wb = local_e8 + *(int *)&local_20->saved_wb;
    }
  }
  av1_accumulate_pack_bs_thread_data(local_10,&local_10->td);
  return;
}

Assistant:

static void write_tile_obu(
    AV1_COMP *const cpi, uint8_t *const dst, uint32_t *total_size,
    struct aom_write_bit_buffer *saved_wb, uint8_t obu_extn_header,
    const FrameHeaderInfo *fh_info, int *const largest_tile_id,
    unsigned int *max_tile_size, uint32_t *const obu_header_size,
    uint8_t **tile_data_start) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;
  const CommonTileParams *const tiles = &cm->tiles;
  const int tile_cols = tiles->cols;
  const int tile_rows = tiles->rows;
  // Fixed size tile groups for the moment
  const int num_tg_hdrs = cpi->num_tg;
  const int tg_size = (tile_rows * tile_cols + num_tg_hdrs - 1) / num_tg_hdrs;
  int tile_count = 0;
  size_t curr_tg_data_size = 0;
  uint8_t *tile_data_curr = dst;
  int new_tg = 1;
  int is_first_tg = 1;

  av1_reset_pack_bs_thread_data(&cpi->td);
  for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
      const int tile_idx = tile_row * tile_cols + tile_col;
      TileDataEnc *this_tile = &cpi->tile_data[tile_idx];

      int is_last_tile_in_tg = 0;
      if (new_tg) {
        tile_data_curr = dst + *total_size;
        tile_count = 0;
      }
      tile_count++;

      if (tile_count == tg_size || tile_idx == (tile_cols * tile_rows - 1))
        is_last_tile_in_tg = 1;

      xd->tile_ctx = &this_tile->tctx;

      // PackBSParams stores all parameters required to pack tile and header
      // info.
      PackBSParams pack_bs_params;
      pack_bs_params.dst = dst;
      pack_bs_params.curr_tg_hdr_size = 0;
      pack_bs_params.is_last_tile_in_tg = is_last_tile_in_tg;
      pack_bs_params.new_tg = new_tg;
      pack_bs_params.obu_extn_header = obu_extn_header;
      pack_bs_params.obu_header_size = 0;
      pack_bs_params.saved_wb = saved_wb;
      pack_bs_params.tile_col = tile_col;
      pack_bs_params.tile_row = tile_row;
      pack_bs_params.tile_data_curr = tile_data_curr;
      pack_bs_params.total_size = total_size;

      if (new_tg)
        av1_write_obu_tg_tile_headers(cpi, xd, &pack_bs_params, tile_idx);

      av1_pack_tile_info(cpi, &cpi->td, &pack_bs_params);

      if (new_tg) {
        curr_tg_data_size = pack_bs_params.curr_tg_hdr_size;
        *tile_data_start += pack_bs_params.curr_tg_hdr_size;
        *obu_header_size = pack_bs_params.obu_header_size;
        new_tg = 0;
      }
      if (is_last_tile_in_tg) new_tg = 1;

      curr_tg_data_size +=
          (pack_bs_params.buf.size + (is_last_tile_in_tg ? 0 : 4));

      if (pack_bs_params.buf.size > *max_tile_size) {
        *largest_tile_id = tile_idx;
        *max_tile_size = (unsigned int)pack_bs_params.buf.size;
      }

      if (is_last_tile_in_tg)
        av1_write_last_tile_info(cpi, fh_info, saved_wb, &curr_tg_data_size,
                                 tile_data_curr, total_size, tile_data_start,
                                 largest_tile_id, &is_first_tg,
                                 *obu_header_size, obu_extn_header);
      *total_size += (uint32_t)pack_bs_params.buf.size;
    }
  }
  av1_accumulate_pack_bs_thread_data(cpi, &cpi->td);
}